

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DateFormatSymbols::getMonths
          (DateFormatSymbols *this,int32_t *count,DtContextType context,DtWidthType width)

{
  long lVar1;
  undefined *puVar2;
  undefined *puVar3;
  
  if (context == STANDALONE) {
    if (SHORT < width) {
      return (UnicodeString *)0x0;
    }
    puVar2 = &DAT_003a5fc8;
    puVar3 = &DAT_003a5fa8;
  }
  else {
    if ((context != FORMAT) || (SHORT < width)) {
      return (UnicodeString *)0x0;
    }
    puVar2 = &DAT_003a5f88;
    puVar3 = &DAT_003a5f68;
  }
  lVar1 = *(long *)(puVar2 + (long)(int)width * 8);
  *count = *(int32_t *)
            ((long)&(this->super_UObject)._vptr_UObject + *(long *)(puVar3 + (long)(int)width * 8));
  return *(UnicodeString **)((long)&(this->super_UObject)._vptr_UObject + lVar1);
}

Assistant:

const UnicodeString*
DateFormatSymbols::getMonths(int32_t &count, DtContextType context, DtWidthType width ) const
{
    UnicodeString *returnValue = NULL;

    switch (context) {
    case FORMAT :
        switch(width) {
        case WIDE :
            count = fMonthsCount;
            returnValue = fMonths;
            break;
        case ABBREVIATED :
        case SHORT : // no month data for this, defaults to ABBREVIATED
            count = fShortMonthsCount;
            returnValue = fShortMonths;
            break;
        case NARROW :
            count = fNarrowMonthsCount;
            returnValue = fNarrowMonths;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch(width) {
        case WIDE :
            count = fStandaloneMonthsCount;
            returnValue = fStandaloneMonths;
            break;
        case ABBREVIATED :
        case SHORT : // no month data for this, defaults to ABBREVIATED
            count = fStandaloneShortMonthsCount;
            returnValue = fStandaloneShortMonths;
            break;
        case NARROW :
            count = fStandaloneNarrowMonthsCount;
            returnValue = fStandaloneNarrowMonths;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
    return returnValue;
}